

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIScrollBar::~CGUIScrollBar(CGUIScrollBar *this)

{
  ~CGUIScrollBar(this,&VTT);
  operator_delete(this,0x1a0);
  return;
}

Assistant:

CGUIScrollBar::~CGUIScrollBar()
{
	if (UpButton)
		UpButton->drop();

	if (DownButton)
		DownButton->drop();
}